

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O1

bool anon_unknown.dwarf_b576ef::AddContextSpecificSymbols
               (TBuiltInResource *resources,TInfoSink *infoSink,TSymbolTable *symbolTable,
               int version,EProfile profile,SpvVersion *spvVersion,EShLanguage language,
               EShSource source)

{
  bool bVar1;
  int iVar2;
  TBuiltInParseables *pTVar3;
  undefined4 extraout_var;
  
  pTVar3 = CreateBuiltInParseables(infoSink,source);
  if (pTVar3 != (TBuiltInParseables *)0x0) {
    (*pTVar3->_vptr_TBuiltInParseables[3])
              (pTVar3,resources,(ulong)(uint)version,profile,spvVersion,(ulong)language);
    iVar2 = (*pTVar3->_vptr_TBuiltInParseables[4])(pTVar3);
    bVar1 = InitializeSymbolTable
                      ((TString *)CONCAT44(extraout_var,iVar2),version,profile,spvVersion,language,
                       source,infoSink,symbolTable);
    if (bVar1) {
      (*pTVar3->_vptr_TBuiltInParseables[7])
                (pTVar3,(ulong)(uint)version,profile,spvVersion,(ulong)language,symbolTable,
                 resources);
      bVar1 = true;
      goto LAB_0035213c;
    }
  }
  bVar1 = false;
LAB_0035213c:
  if (pTVar3 != (TBuiltInParseables *)0x0) {
    (*pTVar3->_vptr_TBuiltInParseables[1])(pTVar3);
  }
  return bVar1;
}

Assistant:

bool AddContextSpecificSymbols(const TBuiltInResource* resources, TInfoSink& infoSink, TSymbolTable& symbolTable, int version,
                               EProfile profile, const SpvVersion& spvVersion, EShLanguage language, EShSource source)
{
    std::unique_ptr<TBuiltInParseables> builtInParseables(CreateBuiltInParseables(infoSink, source));

    if (builtInParseables == nullptr)
        return false;

    builtInParseables->initialize(*resources, version, profile, spvVersion, language);
    if (!InitializeSymbolTable(builtInParseables->getCommonString(), version, profile, spvVersion, language, source, infoSink, symbolTable))
        return false;
    builtInParseables->identifyBuiltIns(version, profile, spvVersion, language, symbolTable, *resources);

    return true;
}